

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteratedhash.hpp
# Opt level: O0

size_t crypto::iterated_hash<crypto::sha256_transform>::hash
                 (hash_word *state,char *input,size_t length)

{
  bool bVar1;
  ulong in_RDX;
  hash_word aligned_buffer [16];
  hash_word *in_stack_00000248;
  hash_word *in_stack_00000250;
  void *in_stack_ffffffffffffffa0;
  undefined1 *count;
  uint *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  ulong local_18;
  
  bVar1 = util::big_endian::native();
  local_18 = in_RDX;
  if ((bVar1) && (bVar1 = util::is_aligned<unsigned_int>(in_stack_ffffffffffffffa0), bVar1)) {
    do {
      sha256_transform::transform(in_stack_00000250,in_stack_00000248);
      local_18 = local_18 - 0x40;
    } while (0x3f < local_18);
  }
  else {
    do {
      count = &stack0xffffffffffffffa8;
      boost::size<unsigned_int[16]>((uint (*) [16])0x160e44);
      util::endianness<util::big_endian>::load<unsigned_int>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(size_t)count);
      sha256_transform::transform(in_stack_00000250,in_stack_00000248);
      local_18 = local_18 - 0x40;
    } while (0x3f < local_18);
  }
  return local_18;
}

Assistant:

size_t iterated_hash<T>::hash(hash_word state[hash_size], const char * input, size_t length) {
	
	if(byte_order::native() && util::is_aligned<hash_word>(input)) {
		
		do {
			
			transform::transform(state, reinterpret_cast<const hash_word *>(input));
			
			input += block_size;
			length -= block_size;
			
		} while(length >= block_size);
		
	} else {
		
		do {
			
			hash_word aligned_buffer[block_size / sizeof(hash_word)];
			byte_order::load(input, aligned_buffer, size_t(boost::size(aligned_buffer)));
			
			transform::transform(state, aligned_buffer);
			
			input += block_size;
			length -= block_size;
			
		} while(length >= block_size);
		
	}
	
	return length;
}